

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeSORegRegOperand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  DecodeStatus DVar2;
  uint64_t Address_00;
  DecodeStatus DVar3;
  
  DVar1 = DecodeGPRnopcRegisterClass(Inst,Val & 0xf,Address,Decoder);
  DVar3 = MCDisassembler_Fail;
  if ((DVar1 | 2) == MCDisassembler_Success) {
    DVar2 = DecodeGPRnopcRegisterClass(Inst,Val >> 8 & 0xf,Address_00,Decoder);
    DVar3 = DVar1;
    if (DVar2 != MCDisassembler_Success) {
      if (DVar2 != MCDisassembler_SoftFail) {
        return MCDisassembler_Fail;
      }
      DVar3 = MCDisassembler_SoftFail;
    }
    MCOperand_CreateImm0(Inst,*(int64_t *)(&DAT_001ccb10 + (ulong)(Val >> 5 & 3) * 8));
  }
  return DVar3;
}

Assistant:

static DecodeStatus DecodeSORegRegOperand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	ARM_AM_ShiftOpc Shift;

	unsigned Rm = fieldFromInstruction_4(Val, 0, 4);
	unsigned type = fieldFromInstruction_4(Val, 5, 2);
	unsigned Rs = fieldFromInstruction_4(Val, 8, 4);

	// Register-register
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rs, Address, Decoder)))
		return MCDisassembler_Fail;

	Shift = ARM_AM_lsl;
	switch (type) {
		case 0:
			Shift = ARM_AM_lsl;
			break;
		case 1:
			Shift = ARM_AM_lsr;
			break;
		case 2:
			Shift = ARM_AM_asr;
			break;
		case 3:
			Shift = ARM_AM_ror;
			break;
	}

	MCOperand_CreateImm0(Inst, Shift);

	return S;
}